

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O3

duckdb_decimal * __thiscall
duckdb::TryCastCInternal<duckdb::interval_t,duckdb_decimal,duckdb::TryCast>
          (duckdb_decimal *__return_storage_ptr__,duckdb *this,duckdb_result *result,idx_t col,
          idx_t row)

{
  NotImplementedException *this_00;
  size_type __dnew;
  size_type local_50;
  string local_48;
  
  this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  local_50 = 0x26;
  local_48._M_dataplus._M_p =
       (pointer)::std::__cxx11::string::_M_create((ulong *)&local_48,(ulong)&local_50);
  local_48.field_2._M_allocated_capacity = local_50;
  builtin_strncpy(local_48._M_dataplus._M_p,"Unimplemented type for cast (%s -> %s)",0x26);
  local_48._M_string_length = local_50;
  local_48._M_dataplus._M_p[local_50] = '\0';
  NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
            (this_00,&local_48,INTERVAL,INVALID);
  __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

RESULT_TYPE TryCastCInternal(duckdb_result *result, idx_t col, idx_t row) {
	RESULT_TYPE result_value;
	try {
		if (!OP::template Operation<SOURCE_TYPE, RESULT_TYPE>(UnsafeFetch<SOURCE_TYPE>(result, col, row),
		                                                      result_value)) {
			return FetchDefaultValue::Operation<RESULT_TYPE>();
		}
	} catch (...) {
		return FetchDefaultValue::Operation<RESULT_TYPE>();
	}
	return result_value;
}